

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

DHUDMessage * __thiscall DBaseStatusBar::DetachMessage(DBaseStatusBar *this,DHUDMessage *msg)

{
  DHUDMessage *pDVar1;
  DHUDMessage **local_38;
  DHUDMessage **prev;
  DHUDMessage *probe;
  size_t i;
  DHUDMessage *msg_local;
  DBaseStatusBar *this_local;
  
  probe = (DHUDMessage *)0x0;
  while( true ) {
    if ((DHUDMessage *)0x2 < probe) {
      return (DHUDMessage *)0x0;
    }
    prev = (DHUDMessage **)
           ::TObjPtr::operator_cast_to_DHUDMessage_((TObjPtr *)(this->Messages + (long)probe));
    local_38 = TObjPtr<DHUDMessage>::operator&(this->Messages + (long)probe);
    for (; prev != (DHUDMessage **)0x0 && (DHUDMessage *)prev != msg;
        prev = (DHUDMessage **)::TObjPtr::operator_cast_to_DHUDMessage_((TObjPtr *)(prev + 0x15))) {
      local_38 = TObjPtr<DHUDMessage>::operator&((TObjPtr<DHUDMessage> *)(prev + 0x15));
    }
    if (prev != (DHUDMessage **)0x0) break;
    probe = (DHUDMessage *)((long)&(probe->super_DObject)._vptr_DObject + 1);
  }
  pDVar1 = ::TObjPtr::operator_cast_to_DHUDMessage_((TObjPtr *)(prev + 0x15));
  *local_38 = pDVar1;
  TObjPtr<DHUDMessage>::operator=((TObjPtr<DHUDMessage> *)(prev + 0x15),(DHUDMessage *)0x0);
  if (screen != (DFrameBuffer *)0x0) {
    ST_SetNeedRefresh();
  }
  return (DHUDMessage *)prev;
}

Assistant:

DHUDMessage *DBaseStatusBar::DetachMessage (DHUDMessage *msg)
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *probe = Messages[i];
		DHUDMessage **prev = &Messages[i];

		while (probe && probe != msg)
		{
			prev = &probe->Next;
			probe = probe->Next;
		}
		if (probe != NULL)
		{
			*prev = probe->Next;
			probe->Next = NULL;
			// Redraw the status bar in case it was covered
			if (screen != NULL)
			{
				ST_SetNeedRefresh();
			}
			return probe;
		}
	}
	return NULL;
}